

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

int64_t __thiscall
icu_63::number::impl::DecimalQuantity::toLong(DecimalQuantity *this,bool truncateIfOverflow)

{
  int iVar1;
  int8_t iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  undefined7 in_register_00000031;
  int32_t magnitude;
  int iVar6;
  
  iVar1 = this->scale;
  iVar4 = this->precision + iVar1;
  if (this->lOptPos < iVar4) {
    iVar4 = this->lOptPos;
  }
  iVar4 = iVar4 + -1;
  iVar6 = 0x11;
  if (iVar4 < 0x11) {
    iVar6 = iVar4;
  }
  if ((int)CONCAT71(in_register_00000031,truncateIfOverflow) == 0) {
    iVar6 = iVar4;
  }
  lVar5 = 0;
  for (; -1 < iVar6; iVar6 = iVar6 + -1) {
    iVar2 = getDigitPos(this,iVar6 - iVar1);
    lVar5 = (long)iVar2 + lVar5 * 10;
  }
  lVar3 = -lVar5;
  if ((this->flags & 1U) == 0) {
    lVar3 = lVar5;
  }
  return lVar3;
}

Assistant:

int64_t DecimalQuantity::toLong(bool truncateIfOverflow) const {
    // NOTE: Call sites should be guarded by fitsInLong(), like this:
    // if (dq.fitsInLong()) { /* use dq.toLong() */ } else { /* use some fallback */ }
    // Fallback behavior upon truncateIfOverflow is to truncate at 17 digits.
    uint64_t result = 0L;
    int32_t upperMagnitude = std::min(scale + precision, lOptPos) - 1;
    if (truncateIfOverflow) {
        upperMagnitude = std::min(upperMagnitude, 17);
    }
    for (int32_t magnitude = upperMagnitude; magnitude >= 0; magnitude--) {
        result = result * 10 + getDigitPos(magnitude - scale);
    }
    if (isNegative()) {
        return static_cast<int64_t>(0LL - result); // i.e., -result
    }
    return static_cast<int64_t>(result);
}